

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O2

QRgbaFloat<float> *
fetchGrayscale8To<QRgbaFloat<float>>
          (QRgbaFloat<float> *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  float *pfVar1;
  ulong uVar2;
  byte *pbVar3;
  ulong uVar4;
  float fVar5;
  
  uVar4 = 0;
  uVar2 = (ulong)(uint)count;
  if (count < 1) {
    uVar2 = uVar4;
  }
  pbVar3 = src + index;
  for (; uVar2 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
    fVar5 = (float)*pbVar3 * 0.003921569;
    pfVar1 = (float *)((long)&buffer->r + uVar4);
    *pfVar1 = fVar5;
    pfVar1[1] = fVar5;
    pfVar1[2] = fVar5;
    pfVar1[3] = 1.0;
    pbVar3 = pbVar3 + 1;
  }
  return buffer;
}

Assistant:

static const QRgba *QT_FASTCALL fetchGrayscale8To(QRgba *buffer, const uchar *src, int index, int count,
                                                  const QList<QRgb> *, QDitherInfo *)
{
    for (int i = 0; i < count; ++i) {
        const uint s = src[index + i];
        buffer[i] = QRgba::fromRgba(s, s, s, 255);
    }
    return buffer;
}